

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void stable_grail_merge_without_buffer(int **arr,int len1,int len2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int **ppiVar5;
  long lVar6;
  
  uVar4 = (ulong)(uint)len2;
  if (len1 < len2) {
LAB_0010e520:
    if (len1 != 0) {
      lVar6 = (long)len1;
      iVar1 = stable_grail_bin_search_left(arr + lVar6,(int)uVar4,arr);
      if (iVar1 != 0) {
        stable_grail_rotate(arr,len1,iVar1);
        arr = arr + iVar1;
        uVar4 = (ulong)(uint)((int)uVar4 - iVar1);
      }
      if ((int)uVar4 == 0) {
        return;
      }
      lVar3 = 0;
      ppiVar5 = arr;
      do {
        ppiVar5 = ppiVar5 + 1;
        if (lVar6 + -1 == lVar3) {
          len1 = 0;
          arr = ppiVar5;
          goto LAB_0010e520;
        }
        lVar3 = lVar3 + 1;
      } while (**ppiVar5 <= *arr[lVar6]);
      len1 = len1 - (int)lVar3;
      arr = ppiVar5;
      goto LAB_0010e520;
    }
  }
  else {
LAB_0010e59d:
    iVar1 = (int)uVar4;
    if (iVar1 != 0) {
      iVar2 = stable_grail_bin_search_right(arr,len1,arr + (long)(iVar1 + len1) + -1);
      if (len1 - iVar2 != 0) {
        stable_grail_rotate(arr + iVar2,len1 - iVar2,iVar1);
        len1 = iVar2;
      }
      if (len1 == 0) {
        return;
      }
      uVar4 = (ulong)iVar1;
      do {
        if (uVar4 == 1) {
          uVar4 = 0;
          break;
        }
        lVar6 = uVar4 - 2;
        uVar4 = uVar4 - 1;
      } while (*arr[(long)len1 + -1] <= *arr[len1 + lVar6]);
      goto LAB_0010e59d;
    }
  }
  return;
}

Assistant:

static void GRAIL_MERGE_WITHOUT_BUFFER(SORT_TYPE *arr, int len1, int len2) {
  int h;

  if (len1 < len2) {
    while (len1) {
      h = GRAIL_BIN_SEARCH_LEFT(arr + len1, len2, arr);

      if (h != 0) {
        GRAIL_ROTATE(arr, len1, h);
        arr += h;
        len2 -= h;
      }

      if (len2 == 0) {
        break;
      }

      do {
        arr++;
        len1--;
      } while (len1 && SORT_CMP_A(arr, arr + len1) <= 0);
    }
  } else {
    while (len2) {
      h = GRAIL_BIN_SEARCH_RIGHT(arr, len1, arr + (len1 + len2 - 1));

      if (h != len1) {
        GRAIL_ROTATE(arr + h, len1 - h, len2);
        len1 = h;
      }

      if (len1 == 0) {
        break;
      }

      do {
        len2--;
      } while (len2 && SORT_CMP_A(arr + len1 - 1, arr + len1 + len2 - 1) <= 0);
    }
  }
}